

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::
     Serialization<std::vector<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>_>
     ::save(BinaryBuffer *bb,Vector *v)

{
  pointer x;
  long lVar1;
  size_t s;
  long local_28;
  
  local_28 = ((long)(v->
                    super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(v->
                    super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_28,8);
  if (local_28 != 0) {
    x = (v->
        super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>).
        _M_impl.super__Vector_impl_data._M_start;
    lVar1 = (long)(v->
                  super__Vector_base<diy::AMRLink::Description,_std::allocator<diy::AMRLink::Description>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)x;
    if (lVar1 != 0) {
      lVar1 = (lVar1 >> 3) * -0x7063e7063e7063e7;
      do {
        Serialization<diy::AMRLink::Description>::save(bb,x);
        x = x + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }